

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O3

TermSpec __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::deref
          (InstMatcher *this,TermList var)

{
  bool bVar1;
  Entry *pEVar2;
  ulong uVar3;
  TermSpec TVar4;
  TermList local_18;
  
  while (local_18._content = var._content,
        pEVar2 = Lib::
                 DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::findEntry(&this->_bindings,&local_18), pEVar2 != (Entry *)0x0) {
    bVar1 = (pEVar2->_val).q;
    uVar3 = CONCAT71((int7)((ulong)pEVar2 >> 8),bVar1);
    local_18._content = (pEVar2->_val).t._content;
    if (((local_18._content & 3) == 0) ||
       (var._content = local_18._content, ((uint)local_18._content & 3) == 1 && (bVar1 & 1U) == 0))
    goto LAB_00314bd4;
  }
  uVar3 = (ulong)(((uint)local_18._content & 3) == 1);
LAB_00314bd4:
  TVar4.t._content = local_18._content;
  TVar4._0_8_ = uVar3;
  return TVar4;
}

Assistant:

typename SubstitutionTree<LeafData_>::InstMatcher::TermSpec SubstitutionTree<LeafData_>::InstMatcher::deref(TermList var)
{
  ASS_REP(var.isVar(), var.tag());

#if VDEBUG
  int ctr=0;
#endif
  for(;;) {
    TermSpec res;
    if(!_bindings.find(var, res)) {
	return TermSpec(var.isOrdinaryVar() ? true : false, var);
    }
    if( res.t.isTerm() || (!res.q && res.t.isOrdinaryVar()) ) {
	return res;
    }
    ASS(!res.q || !res.t.isSpecialVar());
    var=res.t;
#if VDEBUG
    ctr++;
    ASS_L(ctr,1000000); //assert that there are no cycles
#endif
  }
}